

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

void __thiscall
deqp::sl::ShaderCase::ShaderCase
          (ShaderCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,ExpectResult expectResult,
          vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
          *valueBlocks,GLSLVersion targetVersion,char *vertexSource,char *fragmentSource)

{
  size_type sVar1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  reference local_70;
  ValueBlock *valueBlock;
  ExpectResult local_34;
  char *pcStack_30;
  ExpectResult expectResult_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  ShaderCase *this_local;
  
  local_34 = expectResult;
  pcStack_30 = description;
  description_local = name;
  name_local = (char *)renderCtx;
  renderCtx_local = (RenderContext *)testCtx;
  testCtx_local = (TestContext *)this;
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__ShaderCase_03265460;
  this->m_renderCtx = (RenderContext *)name_local;
  this->m_expectResult = local_34;
  std::vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
  vector(&this->m_valueBlocks,valueBlocks);
  this->m_targetVersion = targetVersion;
  std::__cxx11::string::string((string *)&this->m_vertexSource);
  std::__cxx11::string::string((string *)&this->m_fragmentSource);
  sVar1 = std::
          vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
          ::size(&this->m_valueBlocks);
  if (sVar1 == 0) {
    ValueBlock::ValueBlock((ValueBlock *)&valueBlock);
    std::vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
    ::push_back(&this->m_valueBlocks,(value_type *)&valueBlock);
    ValueBlock::~ValueBlock((ValueBlock *)&valueBlock);
  }
  local_70 = std::
             vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
             ::operator[](&this->m_valueBlocks,0);
  if ((vertexSource == (char *)0x0) || (fragmentSource == (char *)0x0)) {
    if (vertexSource == (char *)0x0) {
      this->m_caseType = CASETYPE_FRAGMENT_ONLY;
      genVertexShader_abi_cxx11_(&local_d0,this,local_70);
      std::__cxx11::string::operator=((string *)&this->m_vertexSource,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      specializeFragmentShader_abi_cxx11_(&local_f0,this,fragmentSource,local_70);
      std::__cxx11::string::operator=((string *)&this->m_fragmentSource,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      this->m_caseType = CASETYPE_VERTEX_ONLY;
      specializeVertexShader_abi_cxx11_(&local_90,this,vertexSource,local_70);
      std::__cxx11::string::operator=((string *)&this->m_vertexSource,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      genFragmentShader_abi_cxx11_(&local_b0,this,local_70);
      std::__cxx11::string::operator=((string *)&this->m_fragmentSource,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  else {
    this->m_caseType = CASETYPE_COMPLETE;
    specializeShaders(this,vertexSource,fragmentSource,&this->m_vertexSource,&this->m_fragmentSource
                      ,local_70);
  }
  return;
}

Assistant:

ShaderCase::ShaderCase(tcu::TestContext& testCtx, RenderContext& renderCtx, const char* name, const char* description,
					   ExpectResult expectResult, const std::vector<ValueBlock>& valueBlocks, GLSLVersion targetVersion,
					   const char* vertexSource, const char* fragmentSource)
	: tcu::TestCase(testCtx, name, description)
	, m_renderCtx(renderCtx)
	, m_expectResult(expectResult)
	, m_valueBlocks(valueBlocks)
	, m_targetVersion(targetVersion)
{
	// If no value blocks given, use an empty one.
	if (m_valueBlocks.size() == 0)
		m_valueBlocks.push_back(ValueBlock());

	// Use first value block to specialize shaders.
	const ValueBlock& valueBlock = m_valueBlocks[0];

	// \todo [2010-04-01 petri] Check that all value blocks have matching values.

	// Generate specialized shader sources.
	if (vertexSource && fragmentSource)
	{
		m_caseType = CASETYPE_COMPLETE;
		specializeShaders(vertexSource, fragmentSource, m_vertexSource, m_fragmentSource, valueBlock);
	}
	else if (vertexSource)
	{
		m_caseType		 = CASETYPE_VERTEX_ONLY;
		m_vertexSource   = specializeVertexShader(vertexSource, valueBlock);
		m_fragmentSource = genFragmentShader(valueBlock);
	}
	else
	{
		DE_ASSERT(fragmentSource);
		m_caseType		 = CASETYPE_FRAGMENT_ONLY;
		m_vertexSource   = genVertexShader(valueBlock);
		m_fragmentSource = specializeFragmentShader(fragmentSource, valueBlock);
	}
}